

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

pair<unsigned_int,_unsigned_int> __thiscall
llvm::SourceMgr::getLineAndColumn(SourceMgr *this,SMLoc Loc,uint BufferID)

{
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var1;
  uint uVar2;
  SrcBuffer *this_00;
  ulong uVar3;
  size_type sVar4;
  pair<unsigned_int,_unsigned_int> pVar5;
  size_t sVar6;
  StringRef Chars;
  StringRef local_28;
  
  if (BufferID == 0) {
    BufferID = FindBufferContainingLoc(this,Loc);
    if (BufferID == 0) {
      __assert_fail("BufferID && \"Invalid Location!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0x85,
                    "std::pair<unsigned int, unsigned int> llvm::SourceMgr::getLineAndColumn(SMLoc, unsigned int) const"
                   );
    }
  }
  this_00 = getBufferInfo(this,BufferID);
  _Var1._M_head_impl =
       (this_00->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  uVar3 = (long)(_Var1._M_head_impl)->BufferEnd - (long)(_Var1._M_head_impl)->BufferStart;
  if (uVar3 < 0x100) {
    uVar2 = SrcBuffer::getLineNumber<unsigned_char>(this_00,Loc.Ptr);
  }
  else if (uVar3 < 0x10000) {
    uVar2 = SrcBuffer::getLineNumber<unsigned_short>(this_00,Loc.Ptr);
  }
  else if (uVar3 >> 0x20 == 0) {
    uVar2 = SrcBuffer::getLineNumber<unsigned_int>(this_00,Loc.Ptr);
  }
  else {
    uVar2 = SrcBuffer::getLineNumber<unsigned_long>(this_00,Loc.Ptr);
  }
  local_28.Data =
       ((this_00->Buffer)._M_t.
        super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
        super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
        super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl)->BufferStart;
  sVar6 = (long)Loc.Ptr - (long)local_28.Data;
  Chars.Length = 2;
  Chars.Data = "\n\r";
  local_28.Length = sVar6;
  sVar4 = StringRef::find_last_of(&local_28,Chars,0xffffffffffffffff);
  pVar5.second = (int)sVar6 - (int)sVar4;
  pVar5.first = uVar2;
  return pVar5;
}

Assistant:

std::pair<unsigned, unsigned>
SourceMgr::getLineAndColumn(SMLoc Loc, unsigned BufferID) const {
  if (!BufferID)
    BufferID = FindBufferContainingLoc(Loc);
  assert(BufferID && "Invalid Location!");

  auto &SB = getBufferInfo(BufferID);
  const char *Ptr = Loc.getPointer();

  size_t Sz = SB.Buffer->getBufferSize();
  unsigned LineNo;
  if (Sz <= std::numeric_limits<uint8_t>::max())
    LineNo = SB.getLineNumber<uint8_t>(Ptr);
  else if (Sz <= std::numeric_limits<uint16_t>::max())
    LineNo = SB.getLineNumber<uint16_t>(Ptr);
  else if (Sz <= std::numeric_limits<uint32_t>::max())
    LineNo = SB.getLineNumber<uint32_t>(Ptr);
  else
    LineNo = SB.getLineNumber<uint64_t>(Ptr);

  const char *BufStart = SB.Buffer->getBufferStart();
  size_t NewlineOffs = StringRef(BufStart, Ptr-BufStart).find_last_of("\n\r");
  if (NewlineOffs == StringRef::npos) NewlineOffs = ~(size_t)0;
  return std::make_pair(LineNo, Ptr-BufStart-NewlineOffs);
}